

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O3

void dbgaddhist(dbgcxdef *ctx,char *buf,int l)

{
  char *__dest;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = ctx->dbgcxhstf;
  if (ctx->dbgcxhstl <= l + uVar2 + 1) {
    __dest = ctx->dbgcxhstp;
    uVar3 = 0;
    if (*__dest != '\0' || 0 < l) {
      uVar3 = 0;
      do {
        lVar1 = uVar3 + 1;
        uVar3 = uVar3 + 1;
      } while ((int)uVar3 < l || __dest[lVar1] != '\0');
    }
    memmove(__dest,__dest + (uVar3 & 0xffffffff),(ulong)(uVar2 - (int)uVar3));
    uVar2 = ctx->dbgcxhstf - (int)uVar3;
    ctx->dbgcxhstf = uVar2;
  }
  memcpy(ctx->dbgcxhstp + uVar2,buf,(long)l);
  ctx->dbgcxhstf = ctx->dbgcxhstf + l;
  return;
}

Assistant:

void dbgaddhist(dbgcxdef *ctx, char *buf, int l)
{
    char *p;
    int   dell;

    if (ctx->dbgcxhstf + l + 1 >= ctx->dbgcxhstl)
    {
        /* delete first lines until we have enough space */
        for (dell = 0, p = ctx->dbgcxhstp ; *p || dell < l ; ++p, ++dell) ;
        if (*p) ++p;
        memmove(ctx->dbgcxhstp, ctx->dbgcxhstp + dell,
                (size_t)(ctx->dbgcxhstf - dell));
        ctx->dbgcxhstf -= dell;
    }
    memcpy(ctx->dbgcxhstp + ctx->dbgcxhstf, buf, (size_t)l);
    ctx->dbgcxhstf += l;
}